

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

string * __thiscall GraphPropagator::available_to_dot_abi_cxx11_(GraphPropagator *this)

{
  int iVar1;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string *in_RDI;
  int e;
  int n;
  string *res;
  int in_stack_fffffffffffffddc;
  GraphPropagator *in_stack_fffffffffffffde0;
  undefined7 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdef;
  undefined7 in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe2c;
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [36];
  int local_8c;
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  int local_28;
  allocator local_12;
  undefined1 local_11;
  
  local_11 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,"graph {\n",&local_12);
  std::allocator<char>::~allocator((allocator<char> *)&local_12);
  for (local_28 = 0; iVar1 = local_28, iVar4 = nbNodes((GraphPropagator *)0x2a9852), iVar1 < iVar4;
      local_28 = local_28 + 1) {
    getNodeVar(in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
    bVar2 = BoolView::isFixed((BoolView *)0x2a988d);
    if (bVar2) {
      getNodeVar(in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
      bVar2 = BoolView::isTrue((BoolView *)in_stack_fffffffffffffde0);
      in_stack_fffffffffffffe2c = CONCAT13(bVar2,(int3)in_stack_fffffffffffffe2c);
      if (bVar2) {
        std::__cxx11::to_string(in_stack_fffffffffffffe2c);
        std::operator+((char *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffde0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
                       (char *)in_stack_fffffffffffffde0);
        std::__cxx11::string::operator+=((string *)in_RDI,local_48);
        std::__cxx11::string::~string(local_48);
        std::__cxx11::string::~string(local_68);
        std::__cxx11::string::~string(local_88);
      }
    }
  }
  local_8c = 0;
  do {
    iVar1 = local_8c;
    iVar4 = nbEdges((GraphPropagator *)0x2a9a53);
    if (iVar4 <= iVar1) {
      std::__cxx11::string::operator+=((string *)in_RDI,"}");
      return in_RDI;
    }
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            getEdgeVar(in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
    uVar3 = BoolView::isFixed((BoolView *)0x2a9a8e);
    if ((bool)uVar3) {
      getEdgeVar(in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
      bVar2 = BoolView::isTrue((BoolView *)in_stack_fffffffffffffde0);
      if (bVar2) goto LAB_002a9ad6;
    }
    else {
LAB_002a9ad6:
      getTail(in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
      std::__cxx11::to_string(in_stack_fffffffffffffe2c);
      std::operator+((char *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffde0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
                     (char *)in_stack_fffffffffffffde0);
      getHead(in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
      std::__cxx11::to_string(in_stack_fffffffffffffe2c);
      std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(uVar3,in_stack_fffffffffffffe10));
      std::__cxx11::string::operator+=((string *)in_RDI,local_b0);
      std::__cxx11::string::~string(local_b0);
      std::__cxx11::string::~string(local_130);
      std::__cxx11::string::~string(local_d0);
      std::__cxx11::string::~string(local_f0);
      std::__cxx11::string::~string(local_110);
      getEdgeVar(in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
      in_stack_fffffffffffffdef = BoolView::isFixed((BoolView *)0x2a9c08);
      if ((bool)in_stack_fffffffffffffdef) {
        in_stack_fffffffffffffde0 =
             (GraphPropagator *)getEdgeVar(in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
        bVar2 = BoolView::isTrue((BoolView *)in_stack_fffffffffffffde0);
        in_stack_fffffffffffffddc = CONCAT13(bVar2,(int3)in_stack_fffffffffffffddc);
        if (bVar2) {
          std::__cxx11::string::operator+=((string *)in_RDI," [color = red] ");
        }
      }
      std::__cxx11::to_string(in_stack_fffffffffffffe2c);
      std::operator+((char *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffde0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
                     (char *)in_stack_fffffffffffffde0);
      std::__cxx11::string::operator+=((string *)in_RDI,local_150);
      std::__cxx11::string::~string(local_150);
      std::__cxx11::string::~string(local_170);
      std::__cxx11::string::~string(local_190);
      std::__cxx11::string::operator+=((string *)in_RDI,";\n");
    }
    local_8c = local_8c + 1;
  } while( true );
}

Assistant:

std::string GraphPropagator::available_to_dot() {
	std::string res = "graph {\n";
	for (int n = 0; n < nbNodes(); n++) {
		if (getNodeVar(n).isFixed() && getNodeVar(n).isTrue()) {
			res += " " + std::to_string(n) + " [color = red];\n";
		}
	}
	for (int e = 0; e < nbEdges(); e++) {
		if (!getEdgeVar(e).isFixed() || getEdgeVar(e).isTrue()) {
			res += " " + std::to_string(getTail(e)) + " -- " + std::to_string(getHead(e));
			if (getEdgeVar(e).isFixed() && getEdgeVar(e).isTrue()) {
				res += " [color = red] ";
			}
			res += "[label = \"" + std::to_string(e) + "\"]";
			res += ";\n";
		}
	}
	res += "}";

	return res;
}